

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void execute_stored_code(vector<unsigned_char,_std::allocator<unsigned_char>_> *code)

{
  uint uVar1;
  int iVar2;
  code *__dest;
  pointer __src;
  int *piVar3;
  char *__s;
  uint *puVar4;
  error_category *peVar5;
  system_error *this;
  size_t sVar6;
  pointer puVar7;
  error_code __ec;
  error_code __ec_00;
  
  __dest = (code *)mmap((void *)0x0,
                        (long)(code->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(code->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start,2,0x22,-1,0);
  if (__dest == (code *)0xffffffffffffffff) {
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    peVar5 = (error_category *)std::_V2::system_category();
    this = (system_error *)__cxa_allocate_exception(0x20);
    __ec._4_4_ = 0;
    __ec._M_value = uVar1;
    __ec._M_cat = peVar5;
    std::system_error::system_error(this,__ec,"Failed to allocate memory for the code");
  }
  else {
    __src = (code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    sVar6 = (long)(code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
    puVar7 = __src;
    if (sVar6 != 0) {
      memmove(__dest,__src,sVar6);
      __src = (code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish;
      puVar7 = (code->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    iVar2 = mprotect(__dest,(long)__src - (long)puVar7,5);
    if (iVar2 == 0) {
      (*__dest)();
      iVar2 = munmap(__dest,(long)(code->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(code->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start);
      if (iVar2 == 0) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: failed to deallocate code memory: ",0x2b);
      piVar3 = __errno_location();
      __s = strerror(*piVar3);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107150);
      }
      else {
        sVar6 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      return;
    }
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    peVar5 = (error_category *)std::_V2::system_category();
    this = (system_error *)__cxa_allocate_exception(0x20);
    __ec_00._4_4_ = 0;
    __ec_00._M_value = uVar1;
    __ec_00._M_cat = peVar5;
    std::system_error::system_error(this,__ec_00,"Failed to change memory permissions");
  }
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void execute_stored_code(const std::vector<byte>& code)
{
    // Allocate
    void* memory = mmap(nullptr, code.size(), PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (memory == MAP_FAILED) {
        std::error_code ec(errno, std::system_category());
        throw std::system_error(ec, "Failed to allocate memory for the code");
    }

    // Copy
    std::copy(code.cbegin(), code.cend(), static_cast<byte*>(memory));

    // Protect (r-x)
    if (mprotect(memory, code.size(), PROT_READ | PROT_EXEC) != 0) {
        std::error_code ec(errno, std::system_category());
        throw std::system_error(ec, "Failed to change memory permissions");
    }

    // Execute
    (reinterpret_cast<void(*)(void)>(memory))();

    // Deallocate
    if (munmap(memory, code.size()) != 0) {
        std::cerr << "Warning: failed to deallocate code memory: "
                  << strerror(errno) << std::endl;
    }
}